

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<int,_unsigned_char,_THashTraits<int>,_TValueTraits<unsigned_char>_>::NewKey
          (TMap<int,_unsigned_char,_THashTraits<int>,_TValueTraits<unsigned_char>_> *this,int key)

{
  Node *pNVar1;
  IPair IVar2;
  Node *pNVar3;
  uint uVar4;
  Node *pNVar5;
  Node *pNVar6;
  
  while (uVar4 = this->Size - 1 & key, pNVar1 = this->Nodes + uVar4,
        this->Nodes[uVar4].Next != (Node *)0x1) {
    pNVar3 = GetFreePos(this);
    if (pNVar3 != (Node *)0x0) {
      pNVar6 = this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key);
      if (this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key) != pNVar1) goto LAB_002f2bd9;
      pNVar3->Next = pNVar1->Next;
      pNVar6 = pNVar3;
      goto LAB_002f2bf3;
    }
    Rehash(this);
  }
LAB_002f2bee:
  pNVar3 = (Node *)0x0;
  pNVar6 = pNVar1;
LAB_002f2bf3:
  pNVar1->Next = pNVar3;
  this->NumUsed = this->NumUsed + 1;
  (pNVar6->Pair).Key = key;
  return pNVar6;
LAB_002f2bd9:
  do {
    pNVar5 = pNVar6;
    pNVar6 = pNVar5->Next;
  } while (pNVar6 != pNVar1);
  pNVar5->Next = pNVar3;
  IVar2 = pNVar1->Pair;
  pNVar3->Next = pNVar1->Next;
  pNVar3->Pair = IVar2;
  goto LAB_002f2bee;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}